

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::urem(APInt *this,APInt *RHS)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  APInt *in_RDX;
  uint64_t val;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint uVar8;
  uint numBits;
  APInt AVar9;
  
  numBits = RHS->BitWidth;
  uVar8 = in_RDX->BitWidth;
  if (numBits != uVar8) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x658,"APInt llvm::APInt::urem(const APInt &) const");
  }
  if (numBits < 0x41) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Remainder by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x65a,"APInt llvm::APInt::urem(const APInt &) const");
    }
    val = (RHS->U).VAL % (in_RDX->U).VAL;
  }
  else {
    uVar4 = countLeadingZerosSlowCase(RHS);
    if (uVar8 < 0x41) {
      uVar1 = (in_RDX->U).VAL;
      if (uVar1 == 0) {
        uVar6 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar6 = (uint)lVar2 ^ 0x3f;
      }
      uVar6 = (uVar8 - 0x40) + uVar6;
    }
    else {
      uVar6 = countLeadingZerosSlowCase(in_RDX);
    }
    if (uVar8 == uVar6) {
      __assert_fail("rhsWords && \"Performing remainder operation by zero ???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x664,"APInt llvm::APInt::urem(const APInt &) const");
    }
    if ((numBits != uVar4) && (uVar8 - uVar6 != 1)) {
      uVar4 = (uint)((ulong)(numBits - uVar4) + 0x3f >> 6);
      uVar8 = (uint)((ulong)(uVar8 - uVar6) + 0x3f >> 6);
      if ((uVar4 < uVar8) || (iVar5 = compare(RHS,in_RDX), iVar5 < 0)) {
        APInt(this,RHS);
        uVar7 = extraout_RDX_00;
        goto LAB_0018145f;
      }
      bVar3 = operator==(RHS,in_RDX);
      if (!bVar3) {
        numBits = RHS->BitWidth;
        if (uVar4 != 1) {
          APInt(this,numBits,0,false);
          divide((RHS->U).pVal,uVar4,(in_RDX->U).pVal,uVar8,(WordType *)0x0,(this->U).pVal);
          uVar7 = extraout_RDX_01;
          goto LAB_0018145f;
        }
        val = *(RHS->U).pVal % *(in_RDX->U).pVal;
        goto LAB_00181455;
      }
      numBits = RHS->BitWidth;
    }
    val = 0;
  }
LAB_00181455:
  APInt(this,numBits,val,false);
  uVar7 = extraout_RDX;
LAB_0018145f:
  AVar9._8_8_ = uVar7;
  AVar9.U.pVal = (uint64_t *)this;
  return AVar9;
}

Assistant:

APInt APInt::urem(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Remainder by zero?");
    return APInt(BitWidth, U.VAL % RHS.U.VAL);
  }

  // Get some facts about the LHS
  unsigned lhsWords = getNumWords(getActiveBits());

  // Get some facts about the RHS
  unsigned rhsBits = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing remainder operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0)
    // 0 % Y ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X % 1 ===> 0
    return APInt(BitWidth, 0);
  if (lhsWords < rhsWords || this->ult(RHS))
    // X % Y ===> X, iff X < Y
    return *this;
  if (*this == RHS)
    // X % X == 0;
    return APInt(BitWidth, 0);
  if (lhsWords == 1)
    // All high words are zero, just use native remainder
    return APInt(BitWidth, U.pVal[0] % RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Remainder(BitWidth, 0);
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, nullptr, Remainder.U.pVal);
  return Remainder;
}